

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBodyInternals.h
# Opt level: O2

void __thiscall
btSoftColliders::CollideCL_SS::Process(CollideCL_SS *this,btDbvtNode *la,btDbvtNode *lb)

{
  float fVar1;
  float fVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  Cluster *cluster;
  Cluster *cluster_00;
  btSoftBody *pbVar5;
  bool bVar6;
  btTransform *wtrs0;
  btTransform *wtrs1;
  Joint *pJVar7;
  long lVar8;
  Body *pBVar9;
  Body *pBVar10;
  byte bVar11;
  float fVar12;
  Joint *local_200;
  btSoftClusterCollisionShape csb;
  btSoftClusterCollisionShape csa;
  sResults res;
  CJoint joint;
  
  bVar11 = 0;
  cluster = (Cluster *)(la->field_2).childs[0];
  cluster_00 = (Cluster *)(lb->field_2).childs[0];
  pbVar5 = this->bodies[0];
  if (((pbVar5 == this->bodies[1]) && ((pbVar5->m_clusterConnectivity).m_size != 0)) &&
     ((pbVar5->m_clusterConnectivity).m_data
      [(long)cluster_00->m_clusterIndex * (long)(pbVar5->m_clusters).m_size +
       (long)cluster->m_clusterIndex] != false)) {
    Process::count = Process::count + 1;
  }
  else {
    btSoftClusterCollisionShape::btSoftClusterCollisionShape(&csa,cluster);
    btSoftClusterCollisionShape::btSoftClusterCollisionShape(&csb,cluster_00);
    wtrs0 = btTransform::getIdentity();
    wtrs1 = btTransform::getIdentity();
    joint.super_Joint._0_16_ = operator-(&cluster->m_com,&cluster_00->m_com);
    bVar6 = btGjkEpaSolver2::SignedDistance
                      ((btConvexShape *)&csa,wtrs0,(btConvexShape *)&csb,wtrs1,(btVector3 *)&joint,
                       &res);
    if (bVar6) {
      joint.super_Joint.m_bodies[1].m_rigid = (btRigidBody *)0x0;
      joint.super_Joint.m_bodies[1].m_collisionObject = (btCollisionObject *)0x0;
      joint.super_Joint.m_bodies[0].m_collisionObject = (btCollisionObject *)0x0;
      joint.super_Joint.m_bodies[1].m_soft = (Cluster *)0x0;
      joint.super_Joint.m_bodies[0].m_rigid = (btRigidBody *)0x0;
      joint.super_Joint.m_delete = false;
      joint.super_Joint._0_16_ = ZEXT816(0x1f23f0);
      bVar6 = ClusterBase::SolveContact
                        (&this->super_ClusterBase,&res,(Body)ZEXT824(cluster),
                         (Body)ZEXT824(cluster_00),&joint);
      if (bVar6) {
        pJVar7 = (Joint *)btAlignedAllocInternal(0xf8,0x10);
        memset(pJVar7->m_bodies,0,0xf0);
        pJVar7->_vptr_Joint = (_func_int **)&PTR__Joint_001f23f0;
        pBVar9 = joint.super_Joint.m_bodies;
        pBVar10 = pJVar7->m_bodies;
        for (lVar8 = 0x7c; lVar8 != 0; lVar8 = lVar8 + -1) {
          *(undefined1 *)&pBVar10->m_soft = *(undefined1 *)&pBVar9->m_soft;
          pBVar9 = (Body *)((long)pBVar9 + (ulong)bVar11 * -2 + 1);
          pBVar10 = (Body *)((long)pBVar10 + (ulong)bVar11 * -2 + 1);
        }
        *(undefined8 *)(pJVar7->m_massmatrix).m_el[0].m_floats =
             joint.super_Joint.m_massmatrix.m_el[0].m_floats._0_8_;
        *(undefined8 *)((pJVar7->m_massmatrix).m_el[0].m_floats + 2) =
             joint.super_Joint.m_massmatrix.m_el[0].m_floats._8_8_;
        *(undefined8 *)(pJVar7->m_massmatrix).m_el[1].m_floats =
             joint.super_Joint.m_massmatrix.m_el[1].m_floats._0_8_;
        *(undefined8 *)((pJVar7->m_massmatrix).m_el[1].m_floats + 2) =
             joint.super_Joint.m_massmatrix.m_el[1].m_floats._8_8_;
        *(undefined8 *)(pJVar7->m_massmatrix).m_el[2].m_floats =
             joint.super_Joint.m_massmatrix.m_el[2].m_floats._0_8_;
        *(undefined8 *)((pJVar7->m_massmatrix).m_el[2].m_floats + 2) =
             joint.super_Joint.m_massmatrix.m_el[2].m_floats._8_8_;
        pJVar7->m_delete = joint.super_Joint.m_delete;
        pJVar7[1]._vptr_Joint = (_func_int **)joint._184_8_;
        pJVar7[1].m_bodies[0].m_soft = (Cluster *)joint.m_rpos[0].m_floats._0_8_;
        *(ulong *)((long)&pJVar7[1].m_bodies[1].m_rigid + 4) =
             CONCAT44(joint.m_normal.m_floats[2],joint.m_normal.m_floats[1]);
        *(undefined8 *)((long)&pJVar7[1].m_bodies[1].m_collisionObject + 4) = joint._236_8_;
        pJVar7[1].m_bodies[1].m_soft = (Cluster *)joint.m_rpos[1].m_floats._8_8_;
        pJVar7[1].m_bodies[1].m_rigid =
             (btRigidBody *)CONCAT44(joint.m_normal.m_floats[1],joint.m_normal.m_floats[0]);
        pJVar7[1].m_bodies[0].m_rigid = (btRigidBody *)joint.m_rpos[0].m_floats._8_8_;
        pJVar7[1].m_bodies[0].m_collisionObject =
             (btCollisionObject *)joint.m_rpos[1].m_floats._0_8_;
        local_200 = pJVar7;
        btAlignedObjectArray<btSoftBody::Joint_*>::push_back(&this->bodies[0]->m_joints,&local_200);
        fVar12 = (this->bodies[0]->m_cfg).kSSHR_CL;
        fVar1 = (this->bodies[0]->m_cfg).kSS_SPLT_CL;
        fVar2 = (this->bodies[1]->m_cfg).kSSHR_CL;
        if (fVar12 <= fVar2) {
          fVar12 = fVar2;
        }
        fVar2 = (this->bodies[1]->m_cfg).kSS_SPLT_CL;
        uVar3 = pJVar7->m_erp;
        uVar4 = pJVar7->m_split;
        pJVar7->m_erp = (float)uVar3 * fVar12;
        pJVar7->m_split = (float)uVar4 * (fVar1 + fVar2) * 0.5;
      }
    }
    btConvexShape::~btConvexShape((btConvexShape *)&csb);
    btConvexShape::~btConvexShape((btConvexShape *)&csa);
  }
  return;
}

Assistant:

void		Process(const btDbvtNode* la,const btDbvtNode* lb)
		{
			btSoftBody::Cluster*		cla=(btSoftBody::Cluster*)la->data;
			btSoftBody::Cluster*		clb=(btSoftBody::Cluster*)lb->data;


			bool connected=false;
			if ((bodies[0]==bodies[1])&&(bodies[0]->m_clusterConnectivity.size()))
			{
				connected = bodies[0]->m_clusterConnectivity[cla->m_clusterIndex+bodies[0]->m_clusters.size()*clb->m_clusterIndex];
			}

			if (!connected)
			{
				btSoftClusterCollisionShape	csa(cla);
				btSoftClusterCollisionShape	csb(clb);
				btGjkEpaSolver2::sResults	res;		
				if(btGjkEpaSolver2::SignedDistance(	&csa,btTransform::getIdentity(),
					&csb,btTransform::getIdentity(),
					cla->m_com-clb->m_com,res))
				{
					btSoftBody::CJoint	joint;
					if(SolveContact(res,cla,clb,joint))
					{
						btSoftBody::CJoint*	pj=new(btAlignedAlloc(sizeof(btSoftBody::CJoint),16)) btSoftBody::CJoint();
						*pj=joint;bodies[0]->m_joints.push_back(pj);
						pj->m_erp	*=	btMax(bodies[0]->m_cfg.kSSHR_CL,bodies[1]->m_cfg.kSSHR_CL);
						pj->m_split	*=	(bodies[0]->m_cfg.kSS_SPLT_CL+bodies[1]->m_cfg.kSS_SPLT_CL)/2;
					}
				}
			} else
			{
				static int count=0;
				count++;
				//printf("count=%d\n",count);
				
			}
		}